

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O2

void qt_memfill_template<quint24>(quint24 *dest,quint24 color,qsizetype count)

{
  long lVar1;
  long lVar2;
  uchar uVar3;
  undefined2 uVar4;
  
  if (count != 0) {
    lVar1 = (count + 7) / 8;
    uVar4 = color.data._0_2_;
    uVar3 = color.data[2];
    lVar2 = lVar1;
    switch((uint)count & 7) {
    case 1:
      goto switchD_005c1573_caseD_1;
    case 2:
      goto switchD_005c1573_caseD_2;
    case 3:
      goto switchD_005c1573_caseD_3;
    case 4:
      goto switchD_005c1573_caseD_4;
    case 5:
      goto switchD_005c1573_caseD_5;
    case 6:
      goto switchD_005c1573_caseD_6;
    case 7:
      goto switchD_005c1573_caseD_7;
    }
    do {
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_7:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_6:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_5:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_4:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_3:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
switchD_005c1573_caseD_2:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
      lVar2 = lVar1;
switchD_005c1573_caseD_1:
      *(undefined2 *)dest->data = uVar4;
      dest->data[2] = uVar3;
      dest = dest + 1;
      lVar1 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

inline void qt_memfill_template(T *dest, T color, qsizetype count)
{
    if (!count)
        return;

    qsizetype n = (count + 7) / 8;
    switch (count & 0x07)
    {
    case 0: do { *dest++ = color; Q_FALLTHROUGH();
    case 7:      *dest++ = color; Q_FALLTHROUGH();
    case 6:      *dest++ = color; Q_FALLTHROUGH();
    case 5:      *dest++ = color; Q_FALLTHROUGH();
    case 4:      *dest++ = color; Q_FALLTHROUGH();
    case 3:      *dest++ = color; Q_FALLTHROUGH();
    case 2:      *dest++ = color; Q_FALLTHROUGH();
    case 1:      *dest++ = color;
    } while (--n > 0);
    }
}